

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandLutExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined4 extraout_var_00;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined8 local_80;
  undefined8 local_78;
  Bmc_EsPar_t local_70;
  undefined4 extraout_var;
  
  local_70.fGlucose = 0;
  local_70.fOrderNodes = 0;
  local_70.fEnumSols = 0;
  local_70.nLutSize = 0;
  local_70.fFewerVars = 0;
  local_70.RuntimeLim = 0;
  local_70.fVerbose = 0;
  local_70._52_4_ = 0;
  local_70.nMajSupp = 0;
  local_70.fMajority = 0;
  local_70.fUseIncr = 0;
  local_70.fOnlyAnd = 0;
  local_98 = 0;
  Extra_UtilGetoptReset();
  local_84 = 1;
  local_80 = 2;
  uVar2 = 0;
  local_90 = 0;
  local_8c = 0;
  local_88 = 0;
  local_94 = 0;
  local_78 = 0;
LAB_00227147:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"INKTiaogvh");
    iVar6 = globalUtilOptind;
    if (iVar1 == 0x49) {
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_00227345;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      uVar4 = CONCAT44(extraout_var_00,iVar1);
      local_78 = uVar4;
LAB_00227255:
      uVar3 = (uint)uVar4;
    }
    else {
      if (iVar1 == 0x4b) {
        if (globalUtilOptind < argc) {
          iVar1 = atoi(argv[globalUtilOptind]);
          uVar4 = CONCAT44(extraout_var,iVar1);
          local_80 = uVar4;
          goto LAB_00227255;
        }
        pcVar7 = "Command line switch \"-K\" should be followed by an integer.\n";
LAB_00227345:
        Abc_Print(-1,pcVar7);
        goto LAB_0022734f;
      }
      if (iVar1 == 0x4e) {
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-N\" should be followed by an integer.\n";
          goto LAB_00227345;
        }
        local_98 = atoi(argv[globalUtilOptind]);
        uVar3 = local_98;
      }
      else {
        if (iVar1 != 0x54) {
          if (iVar1 == 0x61) {
            local_8c = local_8c ^ 1;
          }
          else if (iVar1 == 0x67) {
            local_94 = local_94 ^ 1;
          }
          else if (iVar1 == 0x69) {
            local_90 = local_90 ^ 1;
          }
          else if (iVar1 == 0x6f) {
            local_88 = local_88 ^ 1;
          }
          else {
            if (iVar1 != 0x76) {
              if (iVar1 == -1) {
                local_70.fGlucose = local_94;
                local_70.fOnlyAnd = local_8c;
                local_70.fUseIncr = local_90;
                local_70.RuntimeLim = uVar2;
                local_70.fFewerVars = local_88;
                local_70.nNodes = local_98;
                local_70.fVerbose = local_84;
                uVar2 = (uint)local_80;
                uVar3 = (uint)local_78;
                local_70.nVars = uVar3;
                local_70.nLutSize = uVar2;
                if ((globalUtilOptind + 1 == argc) &&
                   (local_70.pTtStr = argv[globalUtilOptind], local_70.pTtStr != (char *)0x0)) {
                  uVar9 = 1 << ((char)local_78 - 2U & 0x1f);
                  sVar5 = strlen(local_70.pTtStr);
                  if (uVar9 != (uint)sVar5) {
                    Abc_Print(-1,"Truth table is expected to have %d hex digits (instead of %d).\n",
                              (ulong)uVar9,sVar5);
                    return 1;
                  }
                  if ((int)uVar3 <= (int)((uVar2 - 1) * local_98 + 1)) {
                    if (uVar3 < 0xb) {
                      if (uVar2 < 7) {
                        if (local_94 == 0) {
                          Exa3_ManExactSynthesis2(&local_70);
                        }
                        else {
                          Exa3_ManExactSynthesis(&local_70);
                        }
                        return 0;
                      }
                      pcVar7 = "Node size should not be more than 6 inputs.\n";
                    }
                    else {
                      pcVar7 = "Function should not have more than 10 inputs.\n";
                    }
                    Abc_Print(-1,pcVar7);
                    return 1;
                  }
                  Abc_Print(-1,
                            "Function with %d variales cannot be implemented with %d %d-input LUTs.\n"
                           );
                  return 1;
                }
                pcVar7 = "Truth table should be given on the command line.\n";
                iVar6 = -1;
                goto LAB_00227475;
              }
              goto LAB_0022734f;
            }
            local_84 = local_84 ^ 1;
          }
          goto LAB_00227147;
        }
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-T\" should be followed by an integer.\n";
          goto LAB_00227345;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        uVar3 = uVar2;
      }
    }
    globalUtilOptind = iVar6 + 1;
    if ((int)uVar3 < 0) {
LAB_0022734f:
      iVar6 = -2;
      Abc_Print(-2,"usage: lutexact [-INKT <num>] [-iaogvh] <hex>\n");
      Abc_Print(-2,"\t           exact synthesis of I-input function using N K-input gates\n");
      Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",local_78);
      Abc_Print(-2,"\t-N <num> : the number of K-input nodes [default = %d]\n",(ulong)local_98);
      Abc_Print(-2,"\t-K <num> : the number of node fanins [default = %d]\n",local_80);
      Abc_Print(-2,"\t-T <num> : the runtime limit in seconds [default = %d]\n",(ulong)uVar2);
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (local_90 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-i       : toggle using incremental solving [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_8c == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_88 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-o       : toggle using additional optimizations [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (local_94 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,
                "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar7);
      if (local_84 == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      pcVar7 = "\t<hex>    : truth table in hex notation\n";
LAB_00227475:
      Abc_Print(iVar6,pcVar7);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandLutExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Exa3_ManExactSynthesis( Bmc_EsPar_t * pPars );
    extern void Exa3_ManExactSynthesis2( Bmc_EsPar_t * pPars );
    int c;
    Bmc_EsPar_t Pars, * pPars = &Pars;
    Bmc_EsParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "INKTiaogvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodes < 0 )
                goto usage;
            break;
       case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->RuntimeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->RuntimeLim < 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseIncr ^= 1;
            break;
        case 'a':
            pPars->fOnlyAnd ^= 1;
            break;
        case 'o':
            pPars->fFewerVars ^= 1;
            break;
        case 'g':
            pPars->fGlucose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
        pPars->pTtStr = argv[globalUtilOptind];
    if ( pPars->pTtStr == NULL )
    {
        Abc_Print( -1, "Truth table should be given on the command line.\n" );
        return 1;
    }
    if ( (1 << (pPars->nVars-2)) != (int)strlen(pPars->pTtStr) )
    {
        Abc_Print( -1, "Truth table is expected to have %d hex digits (instead of %d).\n", (1 << (pPars->nVars-2)), strlen(pPars->pTtStr) );
        return 1;
    }
    if ( pPars->nVars > pPars->nNodes * (pPars->nLutSize - 1) + 1 )
    {
        Abc_Print( -1, "Function with %d variales cannot be implemented with %d %d-input LUTs.\n", pPars->nVars, pPars->nNodes, pPars->nLutSize );
        return 1;
    }
    if ( pPars->nVars > 10 )
    {
        Abc_Print( -1, "Function should not have more than 10 inputs.\n" );
        return 1;
    }
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Node size should not be more than 6 inputs.\n" );
        return 1;
    }
    if ( pPars->fGlucose )
        Exa3_ManExactSynthesis( pPars );
    else
        Exa3_ManExactSynthesis2( pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: lutexact [-INKT <num>] [-iaogvh] <hex>\n" );
    Abc_Print( -2, "\t           exact synthesis of I-input function using N K-input gates\n" );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", pPars->nVars );
    Abc_Print( -2, "\t-N <num> : the number of K-input nodes [default = %d]\n", pPars->nNodes );
    Abc_Print( -2, "\t-K <num> : the number of node fanins [default = %d]\n", pPars->nLutSize );
    Abc_Print( -2, "\t-T <num> : the runtime limit in seconds [default = %d]\n", pPars->RuntimeLim );
    Abc_Print( -2, "\t-i       : toggle using incremental solving [default = %s]\n", pPars->fUseIncr ? "yes" : "no" );
    Abc_Print( -2, "\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n", pPars->fOnlyAnd ? "yes" : "no" );
    Abc_Print( -2, "\t-o       : toggle using additional optimizations [default = %s]\n", pPars->fFewerVars ? "yes" : "no" );
    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t<hex>    : truth table in hex notation\n" );
    return 1;
}